

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_bases.cc
# Opt level: O0

void google::protobuf::internal::ZeroFieldsBase::MergeImpl
               (MessageLite *to_param,MessageLite *from_param)

{
  ZeroFieldsBase **v1;
  ZeroFieldsBase **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  LogMessage local_48;
  Voidify local_31;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  ZeroFieldsBase *from;
  ZeroFieldsBase *to;
  MessageLite *from_param_local;
  MessageLite *to_param_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_param;
  from = (ZeroFieldsBase *)to_param;
  to = (ZeroFieldsBase *)from_param;
  from_param_local = to_param;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::ZeroFieldsBase_const*>
                 ((ZeroFieldsBase **)&absl_log_internal_check_op_result);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::ZeroFieldsBase*>(&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::internal::ZeroFieldsBase_const*,google::protobuf::internal::ZeroFieldsBase*>
                       (v1,v2,"from != to");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_bases.cc"
               ,0x45,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_48);
  }
  InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)(absl_log_internal_check_op_result + 8));
  return;
}

Assistant:

void ZeroFieldsBase::MergeImpl(MessageLite& to_param,
                               const MessageLite& from_param) {
  auto* to = static_cast<ZeroFieldsBase*>(&to_param);
  const auto* from = static_cast<const ZeroFieldsBase*>(&from_param);
  ABSL_DCHECK_NE(from, to);
  to->_internal_metadata_.MergeFrom<UnknownFieldSet>(from->_internal_metadata_);
}